

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_net.c
# Opt level: O0

void socket_close(int socket)

{
  int socket_local;
  
  if (-1 < socket) {
    close(socket);
  }
  return;
}

Assistant:

void socket_close(int socket)
{
#ifdef _WIN32
    closesocket(socket);
#else
    if (socket < 0) return;
    close(socket);
#endif
}